

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O3

int map_bucket_realloc(map m)

{
  void *__ptr;
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  undefined8 local_48;
  size_t local_40;
  size_t sStack_38;
  bucket local_30;
  map_cb_hash local_28;
  map_cb_compare p_Stack_20;
  
  fVar5 = (float)m->count / (float)m->capacity;
  if (((m->prime == 0) || (lVar3 = -1, 0.1 < fVar5)) && (lVar3 = 1, fVar5 < 0.77)) {
    return 0;
  }
  sStack_38 = m->prime + lVar3;
  local_28 = m->hash_cb;
  p_Stack_20 = m->compare_cb;
  local_48 = 0;
  local_40 = bucket_capacity(sStack_38);
  local_30 = bucket_create(local_40);
  if (local_30 == (bucket)0x0) {
    iVar1 = 1;
  }
  else {
    map_iterate(m,map_bucket_realloc_iterator,&local_48);
    uVar2 = m->capacity;
    if (uVar2 != 0) {
      lVar3 = 0x10;
      uVar4 = 0;
      do {
        __ptr = *(void **)((long)&m->buckets->count + lVar3);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          uVar2 = m->capacity;
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar4 < uVar2);
    }
    free(m->buckets);
    m->capacity = local_40;
    m->prime = sStack_38;
    m->buckets = local_30;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int map_bucket_realloc(map m)
{
	struct map_type new_map;
	size_t prime = m->prime;
	float ratio = (float)((float)m->count / (float)m->capacity);

	if (prime > 0 && ratio <= MAP_BUCKET_RATIO_MIN)
	{
		--prime;
	}
	else if (ratio >= MAP_BUCKET_RATIO_MAX)
	{
		++prime;
	}
	else
	{
		return 0;
	}

	new_map.hash_cb = m->hash_cb;
	new_map.compare_cb = m->compare_cb;
	new_map.count = 0;
	new_map.prime = prime;
	new_map.capacity = bucket_capacity(prime);
	new_map.buckets = bucket_create(new_map.capacity);

	if (new_map.buckets != NULL)
	{
		size_t iterator;

		map_iterate(m, &map_bucket_realloc_iterator, &new_map);

		for (iterator = 0; iterator < m->capacity; ++iterator)
		{
			bucket b = &m->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(m->buckets);

		m->capacity = new_map.capacity;
		m->prime = new_map.prime;
		m->buckets = new_map.buckets;

		return 0;
	}

	return 1;
}